

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliffs.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  bool bVar6;
  int baud;
  RobotModel model;
  string port;
  Create robot;
  allocator local_1ed;
  undefined4 local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  long local_1d8;
  undefined4 local_1c4;
  char *local_1c0 [2];
  char local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  Create local_180 [336];
  
  local_1d8 = ___cxa_end_catch;
  local_1e8 = CONCAT44(create::RobotModel::CREATE_2._4_4_,(undefined4)create::RobotModel::CREATE_2);
  uStack_1e0 = CONCAT44(uRam00000000001090fc,_Init);
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/dev/ttyUSB0","");
  local_1ec = 0x1c200;
  if (argc < 2) {
    bVar6 = false;
  }
  else {
    std::__cxx11::string::string((string *)local_1a0,argv[1],&local_1ed);
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    bVar6 = iVar2 == 0;
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
  }
  if (bVar6) {
    local_1d8 = std::cout;
    local_1e8 = create::RobotModel::CREATE_1;
    uStack_1e0 = ___ostream_insert<char,std::char_traits<char>>;
    local_1ec = 0xe100;
    pcVar5 = "Running driver for Create 1";
  }
  else {
    pcVar5 = "Running driver for Create 2";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  create::Create::Create(local_180,1);
  cVar1 = create::Create::connect((string *)local_180,(int *)local_1c0);
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Connected to robot",0x12);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    local_1c4 = 3;
    create::Create::setMode((CreateMode *)local_180);
    do {
      create::Create::isCliffLeft();
      create::Create::isCliffFrontLeft();
      create::Create::isCliffFrontRight();
      create::Create::isCliffRight();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\rCliffs (left to right): [ ",0x1b);
      poVar4 = std::ostream::_M_insert<bool>(true);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ]",2);
      usleep(10000);
    } while( true );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Failed to connect to robot on port ",0x23);
  pcVar5 = local_1c0[0];
  if (local_1c0[0] == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1090d0);
  }
  else {
    sVar3 = strlen(local_1c0[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  create::Create::~Create(local_180);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud)) {
    std::cout << "Connected to robot" << std::endl;
  }
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  while (true) {
    // Get cliff status
    const bool cliff_left = robot.isCliffLeft();
    const bool cliff_front_left = robot.isCliffFrontLeft();
    const bool cliff_front_right = robot.isCliffFrontRight();
    const bool cliff_right = robot.isCliffRight();

    // Print status
    std::cout << "\rCliffs (left to right): [ " <<
      cliff_left <<
      ", " <<
      cliff_front_left <<
      ", " <<
      cliff_front_right <<
      ", " <<
      cliff_right <<
      " ]";

    usleep(10000);  // 10 Hz
  }

  return 0;
}